

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlTextReaderPtr xmlReaderWalker(xmlDocPtr doc)

{
  xmlGenericErrorFunc p_Var1;
  xmlTextReaderPtr __s;
  xmlDictPtr pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  if (doc == (xmlDocPtr)0x0) {
    __s = (xmlTextReaderPtr)0x0;
  }
  else {
    __s = (xmlTextReaderPtr)(*xmlMalloc)(0x150);
    if (__s == (xmlTextReaderPtr)0x0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      __s = (xmlTextReaderPtr)0x0;
      (*p_Var1)(*ppvVar4,"xmlNewTextReader : malloc failed\n");
    }
    else {
      memset(__s,0,0x150);
      __s->allocs = 2;
      __s->state = XML_TEXTREADER_START;
      __s->doc = doc;
      pxVar2 = xmlDictCreate();
      __s->dict = pxVar2;
    }
  }
  return __s;
}

Assistant:

xmlTextReaderPtr
xmlReaderWalker(xmlDocPtr doc)
{
    xmlTextReaderPtr ret;

    if (doc == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewTextReader : malloc failed\n");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlTextReader));
    ret->entNr = 0;
    ret->input = NULL;
    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    ret->base = 0;
    ret->cur = 0;
    ret->allocs = XML_TEXTREADER_CTXT;
    ret->doc = doc;
    ret->state = XML_TEXTREADER_START;
    ret->dict = xmlDictCreate();
    return(ret);
}